

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfPbrMetallicRoughness(PbrMetallicRoughness *pbr,json *o)

{
  initializer_list<double> __l;
  bool bVar1;
  char cVar2;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  json texinfo_1;
  json texinfo;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator<double> local_69;
  double local_68 [5];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> default_baseColorFactor;
  json *o_local;
  PbrMetallicRoughness *pbr_local;
  
  local_68[2] = 1.0;
  local_68[3] = 1.0;
  local_68[0] = 1.0;
  local_68[1] = 1.0;
  local_40 = local_68;
  local_38 = 4;
  default_baseColorFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)o;
  std::allocator<double>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,__l,&local_69);
  std::allocator<double>::~allocator(&local_69);
  bVar1 = Equals(&pbr->baseColorFactor,(vector<double,_std::allocator<double>_> *)local_30);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"baseColorFactor",&local_a1);
    SerializeNumberArrayProperty<double>
              (&local_a0,&pbr->baseColorFactor,
               (json *)default_baseColorFactor.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if (1e-12 <= ABS(1.0 - pbr->metallicFactor)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"metallicFactor",&local_c9);
    SerializeNumberProperty<double>
              (&local_c8,pbr->metallicFactor,
               (json *)default_baseColorFactor.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  if (1e-12 <= ABS(1.0 - pbr->roughnessFactor)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f0,"roughnessFactor",(allocator *)((long)&texinfo.m_value + 7));
    SerializeNumberProperty<double>
              (&local_f0,pbr->roughnessFactor,
               (json *)default_baseColorFactor.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&texinfo.m_value + 7));
  }
  if (-1 < (pbr->baseColorTexture).index) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)&texinfo_1.m_value,(nullptr_t)0x0);
    SerializeGltfTextureInfo(&pbr->baseColorTexture,(json *)&texinfo_1.m_value);
    anon_unknown_57::JsonAddMember
              ((json *)default_baseColorFactor.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,"baseColorTexture",
               (json *)&texinfo_1.m_value);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&texinfo_1.m_value);
  }
  if (-1 < (pbr->metallicRoughnessTexture).index) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_118,(nullptr_t)0x0);
    SerializeGltfTextureInfo
              (&pbr->metallicRoughnessTexture,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_118);
    anon_unknown_57::JsonAddMember
              ((json *)default_baseColorFactor.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,"metallicRoughnessTexture",
               (json *)local_118);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_118);
  }
  SerializeExtensionMap
            (&pbr->extensions,
             (json *)default_baseColorFactor.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  cVar2 = Value::Type(&pbr->extras);
  if (cVar2 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_138,"extras",&local_139);
    SerializeValue(&local_138,&pbr->extras,
                   (json *)default_baseColorFactor.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

static void SerializeGltfPbrMetallicRoughness(PbrMetallicRoughness &pbr,
                                              json &o) {
  std::vector<double> default_baseColorFactor = {1.0, 1.0, 1.0, 1.0};
  if (!Equals(pbr.baseColorFactor, default_baseColorFactor)) {
    SerializeNumberArrayProperty<double>("baseColorFactor", pbr.baseColorFactor,
                                         o);
  }

  if (!TINYGLTF_DOUBLE_EQUAL(pbr.metallicFactor, 1.0)) {
    SerializeNumberProperty("metallicFactor", pbr.metallicFactor, o);
  }

  if (!TINYGLTF_DOUBLE_EQUAL(pbr.roughnessFactor, 1.0)) {
    SerializeNumberProperty("roughnessFactor", pbr.roughnessFactor, o);
  }

  if (pbr.baseColorTexture.index > -1) {
    json texinfo;
    SerializeGltfTextureInfo(pbr.baseColorTexture, texinfo);
    JsonAddMember(o, "baseColorTexture", std::move(texinfo));
  }

  if (pbr.metallicRoughnessTexture.index > -1) {
    json texinfo;
    SerializeGltfTextureInfo(pbr.metallicRoughnessTexture, texinfo);
    JsonAddMember(o, "metallicRoughnessTexture", std::move(texinfo));
  }

  SerializeExtensionMap(pbr.extensions, o);

  if (pbr.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", pbr.extras, o);
  }
}